

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddCount.c
# Opt level: O3

double cuddZddCountDoubleStep(DdNode *P,st__table *table,DdNode *base,DdNode *empty)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double *dummy;
  double *local_30;
  double local_28;
  
  if (P != empty) {
    if (P == base) {
      dVar3 = 1.0;
    }
    else {
      iVar1 = st__lookup(table,(char *)P,(char **)&local_30);
      if (iVar1 == 0) {
        dVar2 = cuddZddCountDoubleStep((P->type).kids.E,table,base,empty);
        local_28 = cuddZddCountDoubleStep((P->type).kids.T,table,base,empty);
        local_30 = (double *)malloc(8);
        dVar3 = -1.0;
        if (local_30 != (double *)0x0) {
          dVar3 = dVar2 + local_28;
          *local_30 = dVar3;
          iVar1 = st__insert(table,(char *)P,(char *)local_30);
          if (iVar1 == -10000) {
            if (local_30 != (double *)0x0) {
              free(local_30);
            }
            dVar3 = -1.0;
          }
        }
      }
      else {
        dVar3 = *local_30;
      }
    }
    return dVar3;
  }
  return 0.0;
}

Assistant:

static double
cuddZddCountDoubleStep(
  DdNode * P,
  st__table * table,
  DdNode * base,
  DdNode * empty)
{
    double      res;
    double      *dummy;

    if (P == empty)
        return((double)0.0);
    if (P == base)
        return((double)1.0);

    /* Check cache */
    if ( st__lookup(table, (const char *)P, (char **)&dummy)) {
        res = *dummy;
        return(res);
    }

    res = cuddZddCountDoubleStep(cuddE(P), table, base, empty) +
        cuddZddCountDoubleStep(cuddT(P), table, base, empty);

    dummy = ABC_ALLOC(double, 1);
    if (dummy == NULL) {
        return((double)CUDD_OUT_OF_MEM);
    }
    *dummy = res;
    if ( st__insert(table, (char *)P, (char *)dummy) == st__OUT_OF_MEM) {
        ABC_FREE(dummy);
        return((double)CUDD_OUT_OF_MEM);
    }

    return(res);

}